

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::get_booleanv(NegativeTestContext *ctx)

{
  GLboolean params;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "GL_INVALID_ENUM is generated if pname is not one of the allowed values.","");
  NegativeTestContext::beginSection(ctx,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = local_38._M_dataplus._M_p & 0xffffffffffffff00;
  glu::CallLogWrapper::glGetBooleanv(&ctx->super_CallLogWrapper,0xffffffff,(GLboolean *)&local_38);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void get_booleanv (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not one of the allowed values.");
	GLboolean params = GL_FALSE;
	ctx.glGetBooleanv(-1, &params);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();
}